

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pci.cc
# Opt level: O2

StatusOr<security::pawn::Pci> security::pawn::Pci::Create(void)

{
  int iVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  anon_union_8_1_1246618d_for_StatusOrData<security::pawn::Pci>_1 in_RDI;
  StatusOr<security::pawn::Pci> SVar3;
  string_view message;
  Pci local_19;
  uintptr_t local_18;
  
  iVar1 = iopl(3);
  if (iVar1 == 0) {
    local_19.iopl_done_ = true;
    Pci(&((anon_union_1_2_a3c22f61_for_StatusOrData<security::pawn::Pci>_3 *)((long)in_RDI + 8))->
         data_,&local_19);
    *(undefined8 *)in_RDI = 1;
    ~Pci(&local_19);
    uVar2 = extraout_RDX_00;
  }
  else {
    message._M_str = (char *)0x5f;
    message._M_len = (size_t)&local_18;
    absl::FailedPreconditionError(message);
    *(uintptr_t *)in_RDI = local_18;
    local_18 = 0x37;
    absl::internal_statusor::StatusOrData<security::pawn::Pci>::EnsureNotOk
              ((StatusOrData<security::pawn::Pci> *)in_RDI);
    absl::Status::Unref(local_18);
    uVar2 = extraout_RDX;
  }
  SVar3.super_StatusOrData<security::pawn::Pci>._8_8_ = uVar2;
  SVar3.super_StatusOrData<security::pawn::Pci>.field_0 = in_RDI;
  return (StatusOr<security::pawn::Pci>)SVar3.super_StatusOrData<security::pawn::Pci>;
}

Assistant:

absl::StatusOr<Pci> Pci::Create() {
  // Note: This will not work on Windows, since there is no official API that
  //       allows to do this. A small kernel driver is needed there.
  if (iopl(3 /* Request ring 3 access to all I/O ports. */) !=
      0 /* Success */) {
    return absl::FailedPreconditionError(
        "Failed to acquire I/O privileges. Make sure this "
        "process runs as root and/or has CAP_SYS_RAWIO.");
  }

  Pci pci;
  pci.iopl_done_ = true;
  return std::move(pci);  // GCC 7 needs the extra move
}